

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astDownCastNode_addOntoNodeWithTargetType
          (sysbvm_context_t *context,sysbvm_tuple_t valueExpression,sysbvm_tuple_t targetType)

{
  sysbvm_tuple_t sVar1;
  sysbvm_object_tuple_t *psVar2;
  sysbvm_tuple_t sourcePosition;
  
  if ((valueExpression & 0xf) == 0 && valueExpression != 0) {
    sourcePosition = *(sysbvm_tuple_t *)(valueExpression + 0x10);
  }
  else {
    sourcePosition = 0;
  }
  sVar1 = sysbvm_astLiteralNode_create(context,sourcePosition,targetType);
  psVar2 = sysbvm_context_allocatePointerTuple(context,(context->roots).astDownCastNodeType,6);
  (psVar2->field_1).pointers[0] = sourcePosition;
  psVar2[1].field_1.pointers[0] = sVar1;
  psVar2[2].header.field_0.typePointer = valueExpression;
  psVar2[2].header.identityHashAndFlags = 0xf;
  psVar2[2].header.objectSize = 0;
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_astDownCastNode_addOntoNodeWithTargetType(sysbvm_context_t *context, sysbvm_tuple_t valueExpression, sysbvm_tuple_t targetType)
{
    sysbvm_tuple_t sourcePosition = sysbvm_astNode_getSourcePosition(valueExpression);
    sysbvm_tuple_t targetTypeExpression = sysbvm_astLiteralNode_create(context, sourcePosition, targetType);
    return sysbvm_astDownCastNode_create(context, sourcePosition, targetTypeExpression, valueExpression);
}